

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

bool __thiscall QAccessibleTableHeaderCell::isValid(QAccessibleTableHeaderCell *this)

{
  int iVar1;
  Data *pDVar2;
  bool bVar3;
  int iVar4;
  QWidgetPrivate *pQVar5;
  QAbstractItemModel *pQVar6;
  QWidget *widget;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->view).wp.d;
  if (pDVar2 == (Data *)0x0) {
LAB_00536856:
    pQVar6 = (QAbstractItemModel *)0x0;
  }
  else {
    pQVar6 = (QAbstractItemModel *)0x0;
    if ((*(int *)(pDVar2 + 4) != 0) && ((this->view).wp.value != (QObject *)0x0)) {
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
        widget = (QWidget *)0x0;
      }
      else {
        widget = (QWidget *)(this->view).wp.value;
      }
      pQVar5 = qt_widget_private(widget);
      if (((pQVar5->data).field_0x12 & 4) != 0) goto LAB_00536856;
      pQVar6 = QAbstractItemView::model((QAbstractItemView *)(this->view).wp.value);
    }
  }
  if (pQVar6 != (QAbstractItemModel *)0x0) {
    local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex
              ((QModelIndex *)&local_38,(QAbstractItemView *)(this->view).wp.value);
    iVar1 = this->index;
    if (-1 < iVar1) {
      iVar4 = (**(code **)(*(long *)pQVar6 + 0x78 + (ulong)(this->orientation == Horizontal) * 8))
                        (pQVar6,&local_38);
      bVar3 = iVar1 < iVar4;
      goto LAB_005368af;
    }
  }
  bVar3 = false;
LAB_005368af:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QAccessibleTableHeaderCell::isValid() const
{
    const QAbstractItemModel *theModel = view && !qt_widget_private(view)->data.in_destructor
                                       ? view->model() : nullptr;
    if (!theModel)
        return false;
    const QModelIndex rootIndex = view->rootIndex();
    return (index >= 0) && ((orientation == Qt::Horizontal)
                        ? (index < theModel->columnCount(rootIndex))
                        : (index < theModel->rowCount(rootIndex)));
}